

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void fetchTransformedBilinearARGB32PM_rotate_helper<(TextureBlendType)4>
               (uint *b,uint *end,QTextureData *image,int *fx,int *fy,int fdx,int fdy)

{
  uint uVar1;
  uchar *puVar2;
  uchar *puVar3;
  int *in_RCX;
  QTextureData *in_RDX;
  uint *in_RSI;
  uint *in_RDI;
  int *in_R8;
  uint in_R9D;
  long in_FS_OFFSET;
  int disty;
  int distx;
  uint br;
  uint bl;
  uint tr;
  uint tl;
  uint *s2;
  uint *s1;
  int y2;
  int y1;
  int x2;
  int x1;
  uint in_stack_ffffffffffffffb8;
  uint *local_20;
  int local_18;
  int local_14 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_20 = in_RDI; local_20 < in_RSI; local_20 = local_20 + 1) {
    local_14[2] = *in_RCX >> 0x10;
    local_14[1] = 0xaaaaaaaa;
    local_14[0] = *in_R8 >> 0x10;
    local_18 = -0x55555556;
    fetchTransformedBilinear_pixelBounds<(TextureBlendType)4>
              (in_RDX->width,in_RDX->x1,in_RDX->x2 + -1,local_14 + 2,local_14 + 1);
    fetchTransformedBilinear_pixelBounds<(TextureBlendType)4>
              (in_RDX->height,in_RDX->y1,in_RDX->y2 + -1,local_14,&local_18);
    puVar2 = QTextureData::scanLine(in_RDX,local_14[0]);
    puVar3 = QTextureData::scanLine(in_RDX,local_18);
    uVar1 = interpolate_4_pixels
                      (in_R9D,in_stack_ffffffffffffffb8,(uint)((ulong)puVar2 >> 0x20),(uint)puVar2,
                       (uint)((ulong)puVar3 >> 0x20),(uint)puVar3);
    *local_20 = uVar1;
    *in_RCX = in_R9D + *in_RCX;
    *in_R8 = disty + *in_R8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void QT_FASTCALL fetchTransformedBilinearARGB32PM_rotate_helper(uint *b, uint *end, const QTextureData &image,
                                                                       int &fx, int &fy, int fdx, int fdy)
{
    // if we are zooming more than 8 times, we use 8bit precision for the position.
    while (b < end) {
        int x1 = (fx >> 16);
        int x2;
        int y1 = (fy >> 16);
        int y2;

        fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
        fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);

        const uint *s1 = (const uint *)image.scanLine(y1);
        const uint *s2 = (const uint *)image.scanLine(y2);

        uint tl = s1[x1];
        uint tr = s1[x2];
        uint bl = s2[x1];
        uint br = s2[x2];

        int distx = (fx & 0x0000ffff) >> 8;
        int disty = (fy & 0x0000ffff) >> 8;

        *b = interpolate_4_pixels(tl, tr, bl, br, distx, disty);

        fx += fdx;
        fy += fdy;
        ++b;
    }
}